

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

void push_grp_stack(grp_stack *mystack,grp_stack_data data)

{
  grp_stack_item *pgVar1;
  grp_stack_item_struct *pgVar2;
  grp_stack_item_struct **ppgVar3;
  grp_stack_item_struct *pgVar4;
  
  if (mystack != (grp_stack *)0x0) {
    pgVar1 = mystack->top;
    pgVar2 = (grp_stack_item_struct *)malloc(0x18);
    pgVar2->data = data;
    if (pgVar1 == (grp_stack_item *)0x0) {
      ppgVar3 = &pgVar2->prev;
      pgVar4 = pgVar2;
    }
    else {
      ppgVar3 = &pgVar1->next;
      pgVar4 = pgVar1->next;
      pgVar2->prev = pgVar1;
      pgVar4->prev = pgVar2;
    }
    *ppgVar3 = pgVar2;
    pgVar2->next = pgVar4;
    mystack->top = pgVar2;
    mystack->stack_size = mystack->stack_size + 1;
  }
  return;
}

Assistant:

static void push_grp_stack(grp_stack* mystack, grp_stack_data data) {
  if(!mystack) return;
  mystack->top = grp_stack_append(mystack->top, data);
  ++mystack->stack_size;
  return;
}